

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O0

KktInfo * presolve::dev_kkt_check::initInfo(void)

{
  mapped_type *pmVar1;
  KktInfo *in_RDI;
  KktInfo *info;
  KktInfo *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
  *in_stack_ffffffffffffff00;
  double local_f8;
  double local_f0;
  HighsInt local_e8;
  HighsInt HStack_e4;
  KktConditionDetails local_d8;
  undefined4 local_b4;
  KktConditionDetails local_b0;
  undefined4 local_8c;
  KktConditionDetails local_88;
  undefined4 local_64;
  KktConditionDetails local_60;
  undefined4 local_40;
  KktConditionDetails local_30;
  undefined1 local_9;
  
  local_9 = 0;
  KktInfo::KktInfo(in_stack_fffffffffffffec0);
  KktConditionDetails::KktConditionDetails(&local_30,kColBounds);
  local_40 = 0;
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar1->sum_violation_2 = local_30.sum_violation_2;
  pmVar1->checked = local_30.checked;
  pmVar1->violated = local_30.violated;
  pmVar1->type = local_30.type;
  *(undefined4 *)&pmVar1->field_0x4 = local_30._4_4_;
  pmVar1->max_violation = local_30.max_violation;
  KktConditionDetails::KktConditionDetails(&local_60,kPrimalFeasibility);
  local_64 = 1;
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar1->sum_violation_2 = local_60.sum_violation_2;
  pmVar1->checked = local_60.checked;
  pmVar1->violated = local_60.violated;
  pmVar1->type = local_60.type;
  *(undefined4 *)&pmVar1->field_0x4 = local_60._4_4_;
  pmVar1->max_violation = local_60.max_violation;
  KktConditionDetails::KktConditionDetails(&local_88,kDualFeasibility);
  local_8c = 2;
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar1->sum_violation_2 = local_88.sum_violation_2;
  pmVar1->checked = local_88.checked;
  pmVar1->violated = local_88.violated;
  pmVar1->type = local_88.type;
  *(undefined4 *)&pmVar1->field_0x4 = local_88._4_4_;
  pmVar1->max_violation = local_88.max_violation;
  KktConditionDetails::KktConditionDetails(&local_b0,kComplementarySlackness);
  local_b4 = 3;
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar1->sum_violation_2 = local_b0.sum_violation_2;
  pmVar1->checked = local_b0.checked;
  pmVar1->violated = local_b0.violated;
  pmVar1->type = local_b0.type;
  *(undefined4 *)&pmVar1->field_0x4 = local_b0._4_4_;
  pmVar1->max_violation = local_b0.max_violation;
  KktConditionDetails::KktConditionDetails(&local_d8,kStationarityOfLagrangian);
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,
                        (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pmVar1->sum_violation_2 = local_d8.sum_violation_2;
  pmVar1->checked = local_d8.checked;
  pmVar1->violated = local_d8.violated;
  pmVar1->type = local_d8.type;
  *(undefined4 *)&pmVar1->field_0x4 = local_d8._4_4_;
  pmVar1->max_violation = local_d8.max_violation;
  KktConditionDetails::KktConditionDetails
            ((KktConditionDetails *)&stack0xffffffffffffff00,kBasicFeasibleSolution);
  pmVar1 = std::
           map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
           ::operator[](in_stack_ffffffffffffff00,(key_type *)CONCAT44(5,in_stack_fffffffffffffef8))
  ;
  *(map<presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails,_std::less<presolve::dev_kkt_check::KktCondition>,_std::allocator<std::pair<const_presolve::dev_kkt_check::KktCondition,_presolve::dev_kkt_check::KktConditionDetails>_>_>
    **)pmVar1 = in_stack_ffffffffffffff00;
  pmVar1->max_violation = local_f8;
  pmVar1->sum_violation_2 = local_f0;
  pmVar1->checked = local_e8;
  pmVar1->violated = HStack_e4;
  return in_RDI;
}

Assistant:

KktInfo initInfo() {
  KktInfo info;
  info.rules[KktCondition::kColBounds] =
      KktConditionDetails(KktCondition::kColBounds);
  info.rules[KktCondition::kPrimalFeasibility] =
      KktConditionDetails(KktCondition::kPrimalFeasibility);
  info.rules[KktCondition::kDualFeasibility] =
      KktConditionDetails(KktCondition::kDualFeasibility);
  info.rules[KktCondition::kComplementarySlackness] =
      KktConditionDetails(KktCondition::kComplementarySlackness);
  info.rules[KktCondition::kStationarityOfLagrangian] =
      KktConditionDetails(KktCondition::kStationarityOfLagrangian);
  info.rules[KktCondition::kBasicFeasibleSolution] =
      KktConditionDetails(KktCondition::kBasicFeasibleSolution);
  return info;
}